

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

int64 Js::JavascriptArray::GetIndexFromVar(Var arg,int64 length,ScriptContext *scriptContext)

{
  bool bVar1;
  long *plVar2;
  long local_60 [2];
  double local_50;
  double doubleValue;
  long local_40;
  int32 local_34;
  ScriptContext *pSStack_30;
  int intValue;
  int64 index;
  ScriptContext *scriptContext_local;
  int64 length_local;
  Var arg_local;
  
  index = (int64)scriptContext;
  scriptContext_local = (ScriptContext *)length;
  length_local = (int64)arg;
  bVar1 = TaggedInt::Is(arg);
  if (bVar1) {
    local_34 = TaggedInt::ToInt32((Var)length_local);
    if (local_34 < 0) {
      local_40 = 0;
      doubleValue = (double)((long)&(scriptContext_local->super_ScriptContextInfo).
                                    _vptr_ScriptContextInfo + (long)local_34);
      plVar2 = max<long>(&local_40,(long *)&doubleValue);
      pSStack_30 = (ScriptContext *)*plVar2;
    }
    else {
      pSStack_30 = (ScriptContext *)(long)local_34;
    }
    if ((long)scriptContext_local < (long)pSStack_30) {
      pSStack_30 = scriptContext_local;
    }
  }
  else {
    local_50 = JavascriptConversion::ToInteger((Var)length_local,(ScriptContext *)index);
    if ((double)(long)scriptContext_local < local_50) {
      return (int64)scriptContext_local;
    }
    pSStack_30 = (ScriptContext *)NumberUtilities::TryToInt64(local_50);
    if ((long)pSStack_30 < 0) {
      local_60[1] = 0;
      local_60[0] = (long)&(pSStack_30->super_ScriptContextInfo)._vptr_ScriptContextInfo +
                    (long)&(scriptContext_local->super_ScriptContextInfo)._vptr_ScriptContextInfo;
      plVar2 = max<long>(local_60 + 1,local_60);
      pSStack_30 = (ScriptContext *)*plVar2;
    }
  }
  return (int64)pSStack_30;
}

Assistant:

int64 JavascriptArray::GetIndexFromVar(Js::Var arg, int64 length, ScriptContext* scriptContext)
    {
        int64 index;

        if (TaggedInt::Is(arg))
        {
            int intValue = TaggedInt::ToInt32(arg);

            if (intValue < 0)
            {
                index = max<int64>(0, length + intValue);
            }
            else
            {
                index = intValue;
            }

            if (index > length)
            {
                index = length;
            }
        }
        else
        {
            double doubleValue = JavascriptConversion::ToInteger(arg, scriptContext);

            // Handle the Number.POSITIVE_INFINITY case
            if (doubleValue > length)
            {
                return length;
            }

            index = NumberUtilities::TryToInt64(doubleValue);

            if (index < 0)
            {
                index = max<int64>(0, index + length);
            }
        }

        return index;
    }